

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener.c
# Opt level: O3

void nni_listener_add_stat(nni_listener *l,nni_stat_item *item)

{
  nni_stat_add(&l->st_root,item);
  return;
}

Assistant:

void
nni_listener_add_stat(nni_listener *l, nni_stat_item *item)
{
#ifdef NNG_ENABLE_STATS
	nni_stat_add(&l->st_root, item);
#else
	NNI_ARG_UNUSED(l);
	NNI_ARG_UNUSED(item);
#endif
}